

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetEnumVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  uint32_t i32;
  Type type;
  EnumDescriptor *pEVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  EnumValueDescriptor *this;
  size_t u64;
  FieldOptions *pFVar7;
  char *pcVar8;
  FileDescriptor *descriptor_00;
  int bitIndex;
  int bitIndex_00;
  int bitIndex_01;
  int bitIndex_02;
  int extraout_EDX;
  int extraout_EDX_00;
  int bitIndex_03;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  allocator local_7a9;
  key_type local_7a8;
  allocator local_781;
  key_type local_780;
  allocator local_759;
  key_type local_758;
  allocator local_731;
  key_type local_730;
  allocator local_709;
  key_type local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  allocator local_6c1;
  key_type local_6c0;
  string local_6a0;
  allocator local_679;
  key_type local_678;
  string local_658;
  allocator local_631;
  key_type local_630;
  allocator local_609;
  key_type local_608;
  allocator local_5e1;
  key_type local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator local_559;
  key_type local_558;
  allocator local_531;
  key_type local_530;
  allocator local_509;
  key_type local_508;
  string local_4e8;
  allocator local_4c1;
  key_type local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  allocator local_459;
  key_type local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  allocator local_3f1;
  key_type local_3f0;
  string local_3d0;
  allocator local_3a9;
  key_type local_3a8;
  allocator local_381;
  key_type local_380;
  byte local_35e;
  allocator local_35d;
  byte local_35c;
  byte local_35b;
  byte local_35a;
  allocator local_359;
  key_type local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator local_2f1;
  key_type local_2f0;
  allocator local_2c9;
  key_type local_2c8;
  AlphaNum local_2a8;
  string local_278;
  allocator local_251;
  key_type local_250;
  AlphaNum local_230;
  string local_200;
  allocator local_1d9;
  key_type local_1d8;
  AlphaNum local_1b8;
  string local_188;
  allocator local_161;
  key_type local_160;
  string local_140;
  allocator local_119;
  key_type local_118;
  string local_f8;
  allocator local_d1;
  key_type local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_71;
  key_type local_70;
  string local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  ClassNameResolver *name_resolver_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  local_30 = variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local = (ClassNameResolver *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  pmVar1 = variables_local;
  pEVar4 = FieldDescriptor::enum_type(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
            (&local_50,(ClassNameResolver *)pmVar1,pEVar4);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"type",&local_71);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_a8);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"kt_type",&local_d1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pmVar1 = variables_local;
  pEVar4 = FieldDescriptor::enum_type(_builderBitIndex_local);
  ClassNameResolver::GetMutableClassName<google::protobuf::EnumDescriptor>
            (&local_f8,(ClassNameResolver *)pmVar1,pEVar4);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"mutable_type",&local_119);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_118);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f8);
  ImmutableDefaultValue_abi_cxx11_
            (&local_140,(java *)_builderBitIndex_local,(FieldDescriptor *)variables_local,
             (ClassNameResolver *)info);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"default",&local_161);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_140);
  this = FieldDescriptor::default_value_enum(_builderBitIndex_local);
  iVar3 = EnumValueDescriptor::number(this);
  strings::AlphaNum::AlphaNum(&local_1b8,iVar3);
  StrCat_abi_cxx11_(&local_188,(protobuf *)&local_1b8,a);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"default_number",&local_1d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1d8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_188);
  i32 = internal::WireFormat::MakeTag(_builderBitIndex_local);
  strings::AlphaNum::AlphaNum(&local_230,i32);
  StrCat_abi_cxx11_(&local_200,(protobuf *)&local_230,a_00);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"tag",&local_251);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_250);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_200);
  iVar3 = FieldDescriptor::number(_builderBitIndex_local);
  type = GetType(_builderBitIndex_local);
  u64 = internal::WireFormat::TagSize(iVar3,type);
  strings::AlphaNum::AlphaNum(&local_2a8,u64);
  StrCat_abi_cxx11_(&local_278,(protobuf *)&local_2a8,a_01);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"tag_size",&local_2c9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2c8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_278);
  pFVar7 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar7);
  pmVar1 = local_30;
  pcVar8 = "";
  if (bVar2) {
    pcVar8 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"deprecation",&local_2f1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_2f0);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar8);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pFVar7 = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(pFVar7);
  pmVar1 = local_30;
  local_35a = 0;
  local_35b = 0;
  local_35c = 0;
  local_35e = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_35a = 1;
    std::__cxx11::string::string((string *)&local_358,"name",&local_359);
    local_35b = 1;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_358);
    std::operator+(&local_338,"@kotlin.Deprecated(message = \"Field ",pmVar5);
    local_35c = 1;
    std::operator+(&local_318,&local_338," is deprecated\") ");
  }
  else {
    std::allocator<char>::allocator();
    local_35e = 1;
    std::__cxx11::string::string((string *)&local_318,"",&local_35d);
  }
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"kt_deprecation",&local_381);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_380);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_318);
  if ((local_35e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_35d);
  }
  if ((local_35c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_338);
  }
  if ((local_35b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_358);
  }
  if ((local_35a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
  }
  bVar2 = FieldDescriptor::is_required(_builderBitIndex_local);
  pmVar1 = local_30;
  pcVar8 = "false";
  if (bVar2) {
    pcVar8 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"required",&local_3a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_3a8);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  bVar2 = HasHasbit(_builderBitIndex_local);
  pmVar1 = local_30;
  if (bVar2) {
    GenerateGetBit_abi_cxx11_(&local_3d0,(java *)(ulong)info_local._4_4_,bitIndex);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"get_has_field_bit_message",&local_3f1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3f0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::__cxx11::string::~string((string *)&local_3d0);
    GenerateSetBit_abi_cxx11_(&local_438,(java *)(ulong)info_local._4_4_,bitIndex_00);
    std::operator+(&local_418,&local_438,";");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"set_has_field_bit_message",&local_459);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_458);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_418);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    GenerateClearBit_abi_cxx11_(&local_4a0,(java *)(ulong)info_local._4_4_,bitIndex_01);
    std::operator+(&local_480,&local_4a0,";");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,"clear_has_field_bit_message",&local_4c1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_4c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    GenerateGetBit_abi_cxx11_(&local_4e8,(java *)(ulong)info_local._4_4_,bitIndex_02);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_508,"is_field_present_message",&local_509);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_508);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    std::__cxx11::string::~string((string *)&local_4e8);
    iVar3 = extraout_EDX;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_530,"set_has_field_bit_message",&local_531);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_530);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_558,"clear_has_field_bit_message",&local_559);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_558);
    std::__cxx11::string::operator=((string *)pmVar5,"");
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5e0,"name",&local_5e1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_5e0);
    std::operator+(&local_5c0,pmVar5,"_ != ");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_608,"default",&local_609);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_608);
    std::operator+(&local_5a0,&local_5c0,pmVar5);
    std::operator+(&local_580,&local_5a0,".getNumber()");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_630,"is_field_present_message",&local_631);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_630);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_580);
    std::__cxx11::string::~string((string *)&local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    iVar3 = extraout_EDX_00;
  }
  GenerateGetBitFromLocal_abi_cxx11_(&local_658,(java *)(ulong)(uint)info_local,iVar3);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"get_has_field_bit_from_local",&local_679);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_678);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::__cxx11::string::~string((string *)&local_658);
  GenerateSetBitToLocal_abi_cxx11_(&local_6a0,(java *)(ulong)info_local._4_4_,bitIndex_03);
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c0,"set_has_field_bit_to_local",&local_6c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_6c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string((string *)&local_6a0);
  descriptor_00 = FieldDescriptor::file(_builderBitIndex_local);
  bVar2 = SupportUnknownEnumValue(descriptor_00);
  pmVar1 = local_30;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_708,"type",&local_709);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_708);
    std::operator+(&local_6e8,pmVar5,".UNRECOGNIZED");
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_730,"unknown",&local_731);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_730);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_758,"default",&local_759);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_758);
    pmVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_780,"unknown",&local_781);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_780);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)pmVar5);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
    std::__cxx11::string::~string((string *)&local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
  }
  pmVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"null_check",&local_7a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_7a8);
  std::__cxx11::string::operator=((string *)pmVar5,"value.getClass();\n");
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  return;
}

Assistant:

void SetEnumVariables(const FieldDescriptor* descriptor, int messageBitIndex,
                      int builderBitIndex, const FieldGeneratorInfo* info,
                      ClassNameResolver* name_resolver,
                      std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->enum_type());
  (*variables)["kt_type"] = (*variables)["type"];
  (*variables)["mutable_type"] =
      name_resolver->GetMutableClassName(descriptor->enum_type());
  (*variables)["default"] = ImmutableDefaultValue(descriptor, name_resolver);
  (*variables)["default_number"] =
      StrCat(descriptor->default_value_enum()->number());
  (*variables)["tag"] = StrCat(
      static_cast<int32_t>(internal::WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = StrCat(
      internal::WireFormat::TagSize(descriptor->number(), GetType(descriptor)));
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["kt_deprecation"] =
      descriptor->options().deprecated()
          ? "@kotlin.Deprecated(message = \"Field " + (*variables)["name"] +
                " is deprecated\") "
          : "";
  (*variables)["on_changed"] = "onChanged();";
  // Use deprecated valueOf() method to be compatible with old generated code
  // for v2.5.0/v2.6.1.
  // TODO(xiaofeng): Use "forNumber" when we no longer support compatibility
  // with v2.5.0/v2.6.1, and remove the @SuppressWarnings annotations.
  (*variables)["for_number"] = "valueOf";

  if (HasHasbit(descriptor)) {
    // For singular messages and builders, one bit is used for the hasField bit.
    (*variables)["get_has_field_bit_message"] = GenerateGetBit(messageBitIndex);
    (*variables)["get_has_field_bit_builder"] = GenerateGetBit(builderBitIndex);

    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        GenerateSetBit(messageBitIndex) + ";";
    (*variables)["set_has_field_bit_builder"] =
        GenerateSetBit(builderBitIndex) + ";";
    (*variables)["clear_has_field_bit_builder"] =
        GenerateClearBit(builderBitIndex) + ";";

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["set_has_field_bit_builder"] = "";
    (*variables)["clear_has_field_bit_builder"] = "";

    (*variables)["is_field_present_message"] =
        (*variables)["name"] + "_ != " + (*variables)["default"] +
        ".getNumber()";
  }

  // For repeated builders, one bit is used for whether the array is immutable.
  (*variables)["get_mutable_bit_builder"] = GenerateGetBit(builderBitIndex);
  (*variables)["set_mutable_bit_builder"] = GenerateSetBit(builderBitIndex);
  (*variables)["clear_mutable_bit_builder"] = GenerateClearBit(builderBitIndex);

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builderBitIndex);
  (*variables)["set_has_field_bit_to_local"] =
      GenerateSetBitToLocal(messageBitIndex);

  if (SupportUnknownEnumValue(descriptor->file())) {
    (*variables)["unknown"] = (*variables)["type"] + ".UNRECOGNIZED";
  } else {
    (*variables)["unknown"] = (*variables)["default"];
  }
}